

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void pugi::impl::anon_unknown_0::node_output
               (xml_buffered_writer *writer,xml_node *node,char_t *indent,uint flags,uint depth)

{
  uint *puVar1;
  uint uVar2;
  undefined4 in_register_0000000c;
  size_t sVar3;
  uint *__n;
  char_t *__buf;
  char_t *extraout_RDX;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf_03;
  void *__buf_04;
  void *extraout_RDX_02;
  void *__buf_05;
  void *__buf_06;
  void *extraout_RDX_03;
  void *__buf_07;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *__buf_08;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  void *pvVar4;
  void *extraout_RDX_09;
  void *__buf_09;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  xml_node_struct **ppxVar8;
  xml_node_struct *pxVar9;
  bool bVar10;
  int iStack_50;
  xml_node local_40;
  char *local_38;
  
  sVar3 = CONCAT44(in_register_0000000c,flags);
  __buf = indent;
  uVar2 = depth;
  if ((flags & 5) == 1) {
    while (uVar2 != 0) {
      xml_buffered_writer::write(writer,(int)indent,__buf,sVar3);
      __buf = extraout_RDX;
      uVar2 = uVar2 - 1;
    }
  }
  pxVar9 = node->_root;
  if (pxVar9 == (xml_node_struct *)0x0) {
    __assert_fail("!\"Invalid node type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                  ,0xc84,
                  "void pugi::impl::(anonymous namespace)::node_output(xml_buffered_writer &, const xml_node &, const char_t *, unsigned int, unsigned int)"
                 );
  }
  __n = &switchD_00115ae5::switchdataD_001245c0;
  switch((uint)pxVar9->header & 7) {
  case 0:
    ppxVar8 = &pxVar9->first_child;
    while (pxVar9 = *ppxVar8, pxVar9 != (xml_node_struct *)0x0) {
      local_40._root = pxVar9;
      node_output(writer,&local_40,indent,flags,depth);
      ppxVar8 = &pxVar9->next_sibling;
    }
    return;
  case 1:
    pcVar6 = pxVar9->name;
    __n = (uint *)0x124407;
    if (pcVar6 == (char *)0x0) {
      pcVar6 = "";
    }
    pcVar7 = ":anonymous";
    if (*pcVar6 != '\0') {
      pcVar7 = pcVar6;
    }
    xml_buffered_writer::write(writer,0x3c,__buf,0x124407);
    local_38 = pcVar7;
    xml_buffered_writer::write(writer,(int)pcVar7,__buf_03,(size_t)__n);
    node_output_attributes
              ((anon_unknown_0 *)writer,(xml_buffered_writer *)node,(xml_node *)(ulong)flags,
               (uint)__n);
    pxVar9 = node->_root;
    if ((flags & 4) == 0) {
      if ((pxVar9 == (xml_node_struct *)0x0) ||
         (pxVar9 = pxVar9->first_child, pxVar9 == (xml_node_struct *)0x0)) {
        xml_buffered_writer::write(writer,0x20,(void *)0x2f,0x3e);
        return;
      }
      if ((pxVar9 == pxVar9->prev_sibling_c) &&
         ((uVar2 = (uint)pxVar9->header & 7, __n = (uint *)(ulong)uVar2, uVar2 == 2 ||
          ((pxVar9->header & 7) == 3)))) {
        xml_buffered_writer::write(writer,0x3e,__buf_04,(size_t)__n);
        if (node->_root == (xml_node_struct *)0x0) {
          pcVar6 = "";
        }
        else {
          pxVar9 = node->_root->first_child;
          pcVar6 = "";
          if (pxVar9 != (xml_node_struct *)0x0) {
            uVar2 = (uint)pxVar9->header & 7;
            __n = (uint *)(ulong)uVar2;
            pcVar6 = "";
            if (pxVar9->value != (char_t *)0x0) {
              pcVar6 = pxVar9->value;
            }
            if (uVar2 == 2) {
              __n = (uint *)(ulong)flags;
              text_output(writer,pcVar6,ctx_special_pcdata,flags);
              goto LAB_00115f93;
            }
          }
        }
        text_output_cdata(writer,pcVar6);
      }
      else {
        xml_buffered_writer::write(writer,0x3e,(void *)0xa,(size_t)__n);
        if (node->_root == (xml_node_struct *)0x0) {
          pxVar9 = (xml_node_struct *)0x0;
        }
        else {
          pxVar9 = node->_root->first_child;
        }
        pvVar4 = extraout_RDX_02;
        for (; pxVar9 != (xml_node_struct *)0x0; pxVar9 = pxVar9->next_sibling) {
          __n = (uint *)(ulong)flags;
          local_40._root = pxVar9;
          node_output(writer,&local_40,indent,flags,depth + 1);
          pvVar4 = extraout_RDX_08;
        }
        local_40._root = (xml_node_struct *)0x0;
        if ((flags & 1) != 0) {
          while (bVar10 = depth != 0, depth = depth - 1, bVar10) {
            xml_buffered_writer::write(writer,(int)indent,pvVar4,(size_t)__n);
            pvVar4 = extraout_RDX_09;
          }
        }
      }
LAB_00115f93:
      xml_buffered_writer::write(writer,0x3c,(void *)0x2f,(size_t)__n);
      xml_buffered_writer::write(writer,(int)local_38,__buf_09,(size_t)__n);
      xml_buffered_writer::write(writer,0x3e,(void *)0xa,(size_t)__n);
      return;
    }
    if ((pxVar9 == (xml_node_struct *)0x0) || (pxVar9->first_child == (xml_node_struct *)0x0)) {
      xml_buffered_writer::write(writer,0x20,(void *)0x2f,0x3e);
      return;
    }
    xml_buffered_writer::write(writer,0x3e,__buf_04,(size_t)__n);
    if (node->_root == (xml_node_struct *)0x0) {
      pxVar9 = (xml_node_struct *)0x0;
    }
    else {
      pxVar9 = node->_root->first_child;
    }
    for (; local_40._root = pxVar9, pxVar9 != (xml_node_struct *)0x0; pxVar9 = pxVar9->next_sibling)
    {
      __n = (uint *)(ulong)flags;
      node_output(writer,&local_40,indent,flags,depth + 1);
    }
    xml_buffered_writer::write(writer,0x3c,(void *)0x2f,(size_t)__n);
    xml_buffered_writer::write(writer,(int)local_38,__buf_08,(size_t)__n);
    iStack_50 = 0x3e;
    pvVar4 = extraout_RDX_07;
    goto LAB_00115e53;
  case 2:
    pcVar6 = "";
    if (pxVar9->value != (char_t *)0x0) {
      pcVar6 = pxVar9->value;
    }
    __n = (uint *)(ulong)flags;
    text_output(writer,pcVar6,ctx_special_pcdata,flags);
    pvVar4 = extraout_RDX_00;
    break;
  case 3:
    pcVar6 = "";
    if (pxVar9->value != (char_t *)0x0) {
      pcVar6 = pxVar9->value;
    }
    text_output_cdata(writer,pcVar6);
    pvVar4 = extraout_RDX_01;
    break;
  case 4:
    sVar3 = 0x2d;
    xml_buffered_writer::write(writer,0x3c,(void *)0x21,0x2d);
    if (node->_root == (xml_node_struct *)0x0) {
      iVar5 = 0x124407;
    }
    else {
      pcVar6 = node->_root->value;
      pcVar7 = "";
      if (pcVar6 != (char *)0x0) {
        pcVar7 = pcVar6;
      }
      iVar5 = (int)pcVar7;
    }
    xml_buffered_writer::write(writer,iVar5,__buf_01,sVar3);
    __n = (uint *)0x3e;
    xml_buffered_writer::write(writer,0x2d,(void *)0x2d,0x3e);
    pvVar4 = extraout_RDX_03;
    break;
  default:
    xml_buffered_writer::write(writer,0x3c,(void *)0x3f,0x1245c0);
    if (node->_root == (xml_node_struct *)0x0) {
      iVar5 = 0x1258bc;
    }
    else {
      puVar1 = (uint *)node->_root->name;
      __n = (uint *)0x124407;
      if (puVar1 != (uint *)0x0) {
        __n = puVar1;
      }
      pcVar6 = ":anonymous";
      if ((char)*__n != '\0') {
        pcVar6 = (char *)__n;
      }
      iVar5 = (int)pcVar6;
    }
    xml_buffered_writer::write(writer,iVar5,__buf_00,(size_t)__n);
    pxVar9 = node->_root;
    if (pxVar9 == (xml_node_struct *)0x0) {
      puVar1 = (uint *)0x124407;
LAB_00115d0a:
      if ((char)*puVar1 != '\0') {
        xml_buffered_writer::write(writer,0x20,__buf_05,(size_t)__n);
        if (node->_root == (xml_node_struct *)0x0) {
          iVar5 = 0x124407;
        }
        else {
          pcVar6 = node->_root->value;
          pcVar7 = "";
          if (pcVar6 != (char *)0x0) {
            pcVar7 = pcVar6;
          }
          iVar5 = (int)pcVar7;
        }
        xml_buffered_writer::write(writer,iVar5,__buf_06,(size_t)__n);
      }
    }
    else {
      uVar2 = (uint)pxVar9->header & 7;
      __n = (uint *)(ulong)uVar2;
      if (uVar2 != 6) {
        __n = (uint *)pxVar9->value;
        puVar1 = (uint *)0x124407;
        if (__n != (uint *)0x0) {
          puVar1 = __n;
        }
        goto LAB_00115d0a;
      }
      node_output_attributes
                ((anon_unknown_0 *)writer,(xml_buffered_writer *)node,(xml_node *)(ulong)flags,6);
    }
    xml_buffered_writer::write(writer,0x3f,(void *)0x3e,(size_t)__n);
    pvVar4 = extraout_RDX_04;
    break;
  case 7:
    xml_buffered_writer::write(writer,0x3c,(void *)0x21,0x44);
    __n = (uint *)0x50;
    xml_buffered_writer::write(writer,0x54,(void *)0x59,0x50);
    if (node->_root == (xml_node_struct *)0x0) {
      puVar1 = (uint *)0x124407;
    }
    else {
      __n = (uint *)node->_root->value;
      puVar1 = (uint *)0x124407;
      if (__n != (uint *)0x0) {
        puVar1 = __n;
      }
    }
    pvVar4 = __buf_02;
    if ((char)*puVar1 != '\0') {
      xml_buffered_writer::write(writer,0x20,__buf_02,(size_t)__n);
      if (node->_root == (xml_node_struct *)0x0) {
        iVar5 = 0x124407;
      }
      else {
        pcVar6 = node->_root->value;
        pcVar7 = "";
        if (pcVar6 != (char *)0x0) {
          pcVar7 = pcVar6;
        }
        iVar5 = (int)pcVar7;
      }
      xml_buffered_writer::write(writer,iVar5,__buf_07,(size_t)__n);
      pvVar4 = extraout_RDX_05;
    }
    xml_buffered_writer::write(writer,0x3e,pvVar4,(size_t)__n);
    pvVar4 = extraout_RDX_06;
  }
  if ((flags & 4) != 0) {
    return;
  }
  iStack_50 = 10;
LAB_00115e53:
  xml_buffered_writer::write(writer,iStack_50,pvVar4,(size_t)__n);
  return;
}

Assistant:

PUGI__FN void node_output(xml_buffered_writer& writer, const xml_node& node, const char_t* indent, unsigned int flags, unsigned int depth)
	{
		const char_t* default_name = PUGIXML_TEXT(":anonymous");

		if ((flags & format_indent) != 0 && (flags & format_raw) == 0)
			for (unsigned int i = 0; i < depth; ++i) writer.write(indent);

		switch (node.type())
		{
		case node_document:
		{
			for (xml_node n = node.first_child(); n; n = n.next_sibling())
				node_output(writer, n, indent, flags, depth);
			break;
		}
			
		case node_element:
		{
			const char_t* name = node.name()[0] ? node.name() : default_name;

			writer.write('<');
			writer.write(name);

			node_output_attributes(writer, node, flags);

			if (flags & format_raw)
			{
				if (!node.first_child())
					writer.write(' ', '/', '>');
				else
				{
					writer.write('>');

					for (xml_node n = node.first_child(); n; n = n.next_sibling())
						node_output(writer, n, indent, flags, depth + 1);

					writer.write('<', '/');
					writer.write(name);
					writer.write('>');
				}
			}
			else if (!node.first_child())
				writer.write(' ', '/', '>', '\n');
			else if (node.first_child() == node.last_child() && (node.first_child().type() == node_pcdata || node.first_child().type() == node_cdata))
			{
				writer.write('>');

				if (node.first_child().type() == node_pcdata)
					text_output(writer, node.first_child().value(), ctx_special_pcdata, flags);
				else
					text_output_cdata(writer, node.first_child().value());

				writer.write('<', '/');
				writer.write(name);
				writer.write('>', '\n');
			}
			else
			{
				writer.write('>', '\n');
				
				for (xml_node n = node.first_child(); n; n = n.next_sibling())
					node_output(writer, n, indent, flags, depth + 1);

				if ((flags & format_indent) != 0 && (flags & format_raw) == 0)
					for (unsigned int i = 0; i < depth; ++i) writer.write(indent);
				
				writer.write('<', '/');
				writer.write(name);
				writer.write('>', '\n');
			}

			break;
		}
		
		case node_pcdata:
			text_output(writer, node.value(), ctx_special_pcdata, flags);
			if ((flags & format_raw) == 0) writer.write('\n');
			break;

		case node_cdata:
			text_output_cdata(writer, node.value());
			if ((flags & format_raw) == 0) writer.write('\n');
			break;

		case node_comment:
			writer.write('<', '!', '-', '-');
			writer.write(node.value());
			writer.write('-', '-', '>');
			if ((flags & format_raw) == 0) writer.write('\n');
			break;

		case node_pi:
		case node_declaration:
			writer.write('<', '?');
			writer.write(node.name()[0] ? node.name() : default_name);

			if (node.type() == node_declaration)
			{
				node_output_attributes(writer, node, flags);
			}
			else if (node.value()[0])
			{
				writer.write(' ');
				writer.write(node.value());
			}

			writer.write('?', '>');
			if ((flags & format_raw) == 0) writer.write('\n');
			break;

		case node_doctype:
			writer.write('<', '!', 'D', 'O', 'C');
			writer.write('T', 'Y', 'P', 'E');

			if (node.value()[0])
			{
				writer.write(' ');
				writer.write(node.value());
			}

			writer.write('>');
			if ((flags & format_raw) == 0) writer.write('\n');
			break;

		default:
			assert(!"Invalid node type");
		}
	}